

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_long>::decodeArray
          (FastPForImpl<4U,_unsigned_long> *this,uint32_t *in,size_t length,unsigned_long *out,
          size_t *nvalue)

{
  unsigned_long *puVar1;
  NotEnoughStorage *this_00;
  code *pcVar2;
  ulong req;
  pointer_____offset_0x10___ *ppuVar3;
  size_t nvalue_00;
  uint32_t *in_00;
  size_t thisnvalue;
  size_t local_48;
  uint32_t *local_40;
  size_t local_38;
  
  req = (ulong)*in;
  if (*nvalue < req) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,req);
    pcVar2 = std::runtime_error::~runtime_error;
    ppuVar3 = &NotEnoughStorage::typeinfo;
  }
  else {
    in_00 = in + 1;
    *nvalue = req;
    local_40 = in;
    local_38 = length;
    if (req != 0) {
      puVar1 = out + req;
      do {
        local_48 = 0;
        nvalue_00 = (long)puVar1 - (long)out >> 3;
        if (out + this->PageSize < puVar1) {
          nvalue_00 = (ulong)this->PageSize;
        }
        __decodeArray(this,in_00,&local_48,out,nvalue_00);
        out = out + nvalue_00;
        in_00 = in_00 + local_48;
      } while (out != puVar1);
    }
    if (in_00 <= local_40 + local_38) {
      resetBuffer(this);
      return in_00;
    }
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this_00,"Decode run over output buffer. Potential buffer overflow!");
    ppuVar3 = (pointer_____offset_0x10___ *)&std::logic_error::typeinfo;
    pcVar2 = std::logic_error::~logic_error;
  }
  __cxa_throw(this_00,ppuVar3,pcVar2);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              IntType *out, size_t &nvalue) {
    const uint32_t *const initin(in);
    const size_t mynvalue = *in;
    ++in;
    if (mynvalue > nvalue) throw NotEnoughStorage(mynvalue);
    nvalue = mynvalue;
    const IntType *const finalout(out + nvalue);
    while (out != finalout) {
      size_t thisnvalue(0);
      size_t thissize = static_cast<size_t>(
          finalout > PageSize + out ? PageSize : (finalout - out));

      __decodeArray(in, thisnvalue, out, thissize);
      in += thisnvalue;
      out += thissize;
    }

    if (initin + length < in) {
      throw std::logic_error(
          "Decode run over output buffer. Potential buffer overflow!");
    }

    resetBuffer();  // if you don't do this, the codec has a "memory".
    return in;
  }